

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void learn(nn_quant *nnq,int verbose)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int i;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int g;
  byte *pbVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int al;
  int b;
  int r;
  byte *pbVar20;
  double dVar21;
  ulong local_58;
  ulong local_40;
  
  nnq->alphadec = (nnq->samplefac + -1) / 3 + 0x1e;
  pbVar12 = nnq->thepicture;
  iVar18 = nnq->lengthcount;
  uVar5 = iVar18 / (nnq->samplefac << 2);
  iVar8 = 0;
  lVar10 = 0;
  do {
    nnq->radpower[lVar10] = 0x40000U - (int)lVar10 * iVar8 & 0x7fc00;
    lVar10 = lVar10 + 1;
    iVar8 = iVar8 + 0x100;
  } while (lVar10 != 0x20);
  uVar6 = 1;
  if (0xc6 < uVar5 + 99) {
    uVar6 = (int)uVar5 / 100;
  }
  if (verbose != 0) {
    gd_error_ex(5,"beginning 1D learning: initial radius=%d\n",0x20);
  }
  iVar8 = nnq->lengthcount;
  uVar11 = 0x7cc;
  local_58 = 0x7cc;
  if (iVar8 * -0x412780c5 + 0x41aad6U < 0x8355ad) {
    uVar11 = 0x7ac;
    local_58 = 0x7ac;
    if (iVar8 * -0x16f0e13d + 0x42bcbdU < 0x85797b) {
      local_58 = (ulong)(iVar8 * -0x46707e29 + 0x434911U < 0x869223) << 6 | 0x79c;
    }
  }
  if ((int)uVar5 < 1) {
    dVar21 = 1.0;
  }
  else {
    pbVar20 = pbVar12 + iVar18;
    local_40 = 0x800;
    uVar9 = 0x20;
    iVar18 = 0x400;
    uVar17 = 0;
    do {
      bVar1 = *pbVar12;
      al = (uint)bVar1 * 0x10;
      bVar2 = pbVar12[2];
      b = (uint)bVar2 * 0x10;
      bVar3 = pbVar12[3];
      g = (uint)bVar3 * 0x10;
      bVar4 = pbVar12[1];
      r = (uint)bVar4 * 0x10;
      i = contest(nnq,al,b,g,r);
      iVar8 = nnq->network[i][0];
      iVar7 = nnq->network[i][1];
      iVar14 = (iVar8 + (uint)bVar1 * -0x10) * iVar18;
      iVar13 = iVar14 + 0x3ff;
      if (-1 < iVar14) {
        iVar13 = iVar14;
      }
      iVar15 = (iVar7 + (uint)bVar2 * -0x10) * iVar18;
      iVar14 = iVar15 + 0x3ff;
      if (-1 < iVar15) {
        iVar14 = iVar15;
      }
      nnq->network[i][0] = iVar8 - (iVar13 >> 10);
      nnq->network[i][1] = iVar7 - (iVar14 >> 10);
      iVar8 = nnq->network[i][2];
      iVar13 = (iVar8 + (uint)bVar3 * -0x10) * iVar18;
      iVar7 = iVar13 + 0x3ff;
      if (-1 < iVar13) {
        iVar7 = iVar13;
      }
      nnq->network[i][2] = iVar8 - (iVar7 >> 10);
      iVar8 = nnq->network[i][3];
      iVar13 = (iVar8 + (uint)bVar4 * -0x10) * iVar18;
      iVar7 = iVar13 + 0x3ff;
      if (-1 < iVar13) {
        iVar7 = iVar13;
      }
      nnq->network[i][3] = iVar8 - (iVar7 >> 10);
      if (uVar9 != 0) {
        alterneigh(nnq,uVar9,i,al,b,g,r);
      }
      pbVar12 = pbVar12 + local_58;
      if (pbVar20 <= pbVar12) {
        do {
          pbVar12 = pbVar12 + -(long)nnq->lengthcount;
        } while (pbVar20 <= pbVar12);
      }
      uVar17 = uVar17 + 1;
      uVar11 = (ulong)uVar17 % (ulong)uVar6;
      if ((int)((ulong)uVar17 % (ulong)uVar6) == 0) {
        iVar18 = iVar18 - iVar18 / nnq->alphadec;
        iVar8 = (int)((ulong)((long)(int)local_40 * 0x77777777) >> 0x20) - (int)local_40;
        uVar9 = ((iVar8 >> 4) - (iVar8 >> 0x1f)) + (int)local_40;
        local_40 = (ulong)uVar9;
        uVar9 = (int)uVar9 >> 6;
        if ((int)uVar9 < 2) {
          uVar9 = 0;
          uVar11 = local_40;
        }
        else {
          iVar8 = uVar9 * uVar9;
          uVar19 = 1;
          if (1 < (int)uVar9) {
            uVar19 = (ulong)uVar9;
          }
          uVar16 = 0;
          do {
            iVar7 = (iVar8 - (int)uVar16 * (int)uVar16) * 0x100;
            uVar11 = (long)iVar7 % (long)iVar8 & 0xffffffff;
            nnq->radpower[uVar16] = (iVar7 / iVar8) * iVar18;
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
        }
      }
    } while (uVar17 != uVar5);
    dVar21 = (double)((float)iVar18 * 0.0009765625);
  }
  if (verbose != 0) {
    gd_error_ex(5,"finished 1D learning: final alpha=%f !\n",dVar21,uVar11);
    return;
  }
  return;
}

Assistant:

void learn(nnq, verbose) /* Stu: N.B. added parameter so that main() could control verbosity. */
nn_quant *nnq;
int verbose;
{
	register int i,j,al,b,g,r;
	int radius,rad,alpha,step,delta,samplepixels;
	register unsigned char *p;
	unsigned char *lim;

	nnq->alphadec = 30 + ((nnq->samplefac-1)/3);
	p = nnq->thepicture;
	lim = nnq->thepicture + nnq->lengthcount;
	samplepixels = nnq->lengthcount/(4 * nnq->samplefac);
	/* here's a problem with small images: samplepixels < ncycles => delta = 0 */
	delta = samplepixels/ncycles;
	/* kludge to fix */
	if(delta==0) delta = 1;
	alpha = initalpha;
	radius = initradius;

	rad = radius >> radiusbiasshift;

	for (i=0; i<rad; i++)
		nnq->radpower[i] = alpha*(((rad*rad - i*i)*radbias)/(rad*rad));

	if (verbose) gd_error_ex(GD_NOTICE, "beginning 1D learning: initial radius=%d\n", rad);

	if ((nnq->lengthcount%prime1) != 0) step = 4*prime1;
	else {
		if ((nnq->lengthcount%prime2) !=0) step = 4*prime2;
		else {
			if ((nnq->lengthcount%prime3) !=0) step = 4*prime3;
			else step = 4*prime4;
		}
	}

	i = 0;
	while (i < samplepixels) {
		al = p[ALPHA] << netbiasshift;
		b = p[BLUE] << netbiasshift;
		g = p[GREEN] << netbiasshift;
		r = p[RED] << netbiasshift;
		j = contest(nnq, al,b,g,r);

		altersingle(nnq, alpha,j,al,b,g,r);
		if (rad) alterneigh(nnq, rad,j,al,b,g,r);   /* alter neighbours */

		p += step;
		while (p >= lim) p -= nnq->lengthcount;

		i++;
		if (i%delta == 0) {                    /* FPE here if delta=0*/
			alpha -= alpha / nnq->alphadec;
			radius -= radius / radiusdec;
			rad = radius >> radiusbiasshift;
			if (rad <= 1) rad = 0;
			for (j=0; j<rad; j++)
				nnq->radpower[j] = alpha*(((rad*rad - j*j)*radbias)/(rad*rad));
		}
	}
	if (verbose) gd_error_ex(GD_NOTICE, "finished 1D learning: final alpha=%f !\n",((float)alpha)/initalpha);
}